

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O3

void __thiscall
Test_TemplateModifiers_SnippetEscape::Test_TemplateModifiers_SnippetEscape
          (Test_TemplateModifiers_SnippetEscape *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(TemplateModifiers, SnippetEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestSnippetEscape", NULL);
  dict.SetEscapedValue("easy snippet", "foo",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("valid snippet",
                       "<b>foo<br> &amp; b<wbr>&shy;ar</b>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("invalid snippet",
                       "<b><A HREF='foo'\nid=\"bar\t\t&&{\vbaz\">",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("snippet with italics",
                       "<i>foo<br> &amp; b<wbr>&shy;ar</i>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unclosed snippet",
                       "<b>foo",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("snippet with interleaving",
                       "<b><i>foo</b></i>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unclosed interleaving",
                       "<b><i><b>foo</b>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unclosed",
                       "<b><i>foo",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unterminated 1",
                       "foo<",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unterminated 2",
                       "foo<b",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unterminated 3",
                       "foo</",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unterminated 4",
                       "foo</b",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unterminated 5",
                       "<b>foo</b",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("close b i",
                       "<i><b>foo",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("close i b",
                       "<b><i>foo",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("em",
                       "<em>foo</em>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("nested em",
                       "<b>This is foo<em>...</em></b>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unclosed em",
                       "<em>foo",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("wrongly closed em",
                       "foo</em>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("misnested em",
                       "<i><em>foo</i></em>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("span ltr",
                       "<span dir=ltr>bidi text</span>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("span rtl",
                       "<span dir=rtl>bidi text</span>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("span garbage dir attr",
                       "<span dir=foo>bidi text</span>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("span no dir",
                       "<span>bidi text</span>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("span bad attribute",
                       "<span onclick=alert('foo')>bidi text</span>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("span quotes",
                       "<span dir=\"rtl\">bidi text</span>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("nested span",
                       "<b>This is <span dir=rtl>bidi text</span></b>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("doubly-nested span",
                       "<span dir=rtl>This is <span dir=rtl>"
                       "bidi text</span></span>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("two spans",
                       "<b>This is <span dir=rtl>text</span> that is "
                       "<span dir=rtl>bidi.</span></b>",
                       GOOGLE_NAMESPACE::snippet_escape);
  dict.SetEscapedValue("unclosed span",
                       "<b>This is <span dir=rtl>bidi text",
                       GOOGLE_NAMESPACE::snippet_escape);


  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy snippet"), "foo");
  EXPECT_STREQ(peer.GetSectionValue("valid snippet"),
               "<b>foo<br> &amp; b<wbr>&shy;ar</b>");
  EXPECT_STREQ(peer.GetSectionValue("invalid snippet"),
               "<b>&lt;A HREF=&#39;foo&#39; id=&quot;bar  &&amp;{ "
               "baz&quot;&gt;</b>");
  EXPECT_STREQ(peer.GetSectionValue("snippet with italics"),
               "<i>foo<br> &amp; b<wbr>&shy;ar</i>");
  EXPECT_STREQ(peer.GetSectionValue("unclosed snippet"),
               "<b>foo</b>");
  EXPECT_STREQ(peer.GetSectionValue("snippet with interleaving"),
               "<b><i>foo</b></i>");
  EXPECT_STREQ(peer.GetSectionValue("unclosed interleaving"),
               "<b><i>&lt;b&gt;foo</b></i>");
  EXPECT_STREQ(peer.GetSectionValue("unclosed"),
               "<b><i>foo</i></b>");
  EXPECT_STREQ(peer.GetSectionValue("unterminated 1"), "foo&lt;");
  EXPECT_STREQ(peer.GetSectionValue("unterminated 2"), "foo&lt;b");
  EXPECT_STREQ(peer.GetSectionValue("unterminated 3"), "foo&lt;/");
  EXPECT_STREQ(peer.GetSectionValue("unterminated 4"), "foo&lt;/b");
  EXPECT_STREQ(peer.GetSectionValue("unterminated 5"), "<b>foo&lt;/b</b>");
  EXPECT_STREQ(peer.GetSectionValue("close b i"), "<i><b>foo</b></i>");
  EXPECT_STREQ(peer.GetSectionValue("close i b"), "<b><i>foo</i></b>");
  EXPECT_STREQ(peer.GetSectionValue("em"), "<em>foo</em>");
  EXPECT_STREQ(peer.GetSectionValue("nested em"),
               "<b>This is foo<em>...</em></b>");
  EXPECT_STREQ(peer.GetSectionValue("unclosed em"), "<em>foo</em>");
  EXPECT_STREQ(peer.GetSectionValue("wrongly closed em"), "foo&lt;/em&gt;");
  EXPECT_STREQ(peer.GetSectionValue("misnested em"), "<i><em>foo</i></em>");
  EXPECT_STREQ(peer.GetSectionValue("span ltr"),
               "<span dir=ltr>bidi text</span>");
  EXPECT_STREQ(peer.GetSectionValue("span rtl"),
               "<span dir=rtl>bidi text</span>");
  EXPECT_STREQ(peer.GetSectionValue("span garbage dir attr"),
               "&lt;span dir=foo&gt;bidi text&lt;/span&gt;");
  EXPECT_STREQ(peer.GetSectionValue("span no dir"),
               "&lt;span&gt;bidi text&lt;/span&gt;");
  EXPECT_STREQ(peer.GetSectionValue("span bad attribute"),
               "&lt;span onclick=alert(&#39;foo&#39;)&gt;bidi text&lt;/span&gt;");
  EXPECT_STREQ(peer.GetSectionValue("span quotes"),
               "&lt;span dir=&quot;rtl&quot;&gt;bidi text&lt;/span&gt;");
  EXPECT_STREQ(peer.GetSectionValue("nested span"),
               "<b>This is <span dir=rtl>bidi text</span></b>");
  EXPECT_STREQ(peer.GetSectionValue("doubly-nested span"),
               "<span dir=rtl>This is &lt;span dir=rtl&gt;bidi text"
               "</span>&lt;/span&gt;");
  EXPECT_STREQ(peer.GetSectionValue("two spans"),
               "<b>This is <span dir=rtl>text</span> that is "
               "<span dir=rtl>bidi.</span></b>");
  EXPECT_STREQ(peer.GetSectionValue("unclosed span"),
               "<b>This is <span dir=rtl>bidi text</span></b>");
}